

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O1

bool __thiscall FIX::FieldMap::getFieldIfSet(FieldMap *this,FieldBase *field)

{
  FieldBase *pFVar1;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var2;
  
  _Var2 = lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                    (this,*(FieldBase **)(this + 8),*(FieldBase **)(this + 0x10),field->m_tag);
  pFVar1 = *(FieldBase **)(this + 0x10);
  if (_Var2._M_current != pFVar1) {
    field->m_tag = (_Var2._M_current)->m_tag;
    std::__cxx11::string::_M_assign((string *)&field->m_string);
    (field->m_metrics).m_checksum = ((_Var2._M_current)->m_metrics).m_checksum;
    (field->m_metrics).m_length = ((_Var2._M_current)->m_metrics).m_length;
    (field->m_data)._M_string_length = 0;
    *(field->m_data)._M_dataplus._M_p = '\0';
  }
  return _Var2._M_current != pFVar1;
}

Assistant:

bool getFieldIfSet( FieldBase& field ) const
  {
    Fields::const_iterator iter = findTag( field.getTag() );
    if ( iter == m_fields.end() )
      return false;
    field = (*iter);
    return true;
  }